

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallettool.cpp
# Opt level: O3

void wallet::WalletTool::WalletShowInfo(CWallet *wallet_instance)

{
  WalletDatabase *pWVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  unique_lock<std::recursive_mutex> local_90;
  long *local_80 [2];
  long local_70 [2];
  FormatArg *local_60;
  undefined4 local_58;
  FormatArg local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._M_device = &(wallet_instance->cs_wallet).super_recursive_mutex;
  local_90._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_90);
  tinyformat::detail::formatImpl
            ((ostream *)&std::cout,"Wallet info\n===========\n",(FormatArg *)0x0,0);
  local_50.m_value = &wallet_instance->m_name;
  local_58 = 1;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_60 = &local_50;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Name: %s\n",&local_50,1);
  pWVar1 = (wallet_instance->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar1 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar1->_vptr_WalletDatabase[0xd])(local_80);
  local_58 = 1;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_60 = &local_50;
  local_50.m_value = local_80;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Format: %s\n",&local_50,1);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  bVar2 = CWallet::IsWalletFlagSet(wallet_instance,0x400000000);
  pcVar4 = "no";
  local_80[0] = (long *)0x485edc;
  if (bVar2) {
    local_80[0] = (long *)0x485ed8;
  }
  local_58 = 1;
  local_50.m_value = local_80;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<char_const*>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<char_const*>;
  local_60 = &local_50;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Descriptors: %s\n",&local_50,1);
  bVar2 = CWallet::IsCrypted(wallet_instance);
  local_80[0] = (long *)0x485edc;
  if (bVar2) {
    local_80[0] = (long *)0x485ed8;
  }
  local_58 = 1;
  local_50.m_value = local_80;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<char_const*>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<char_const*>;
  local_60 = &local_50;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Encrypted: %s\n",&local_50,1);
  bVar2 = CWallet::IsHDEnabled(wallet_instance);
  if (bVar2) {
    pcVar4 = "yes";
  }
  local_58 = 1;
  local_50.m_value = local_80;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<char_const*>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<char_const*>;
  local_80[0] = (long *)pcVar4;
  local_60 = &local_50;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"HD (hd seed available): %s\n",&local_50,1);
  uVar3 = CWallet::GetKeyPoolSize(wallet_instance);
  local_80[0] = (long *)CONCAT44(local_80[0]._4_4_,uVar3);
  local_58 = 1;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<unsigned_int>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<unsigned_int>;
  local_60 = &local_50;
  local_50.m_value = local_80;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Keypool Size: %u\n",&local_50,1);
  local_80[0] = (long *)(wallet_instance->mapWallet)._M_h._M_element_count;
  local_58 = 1;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<unsigned_long>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<unsigned_long>;
  local_60 = &local_50;
  local_50.m_value = local_80;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Transactions: %zu\n",&local_50,1);
  local_80[0] = (long *)(wallet_instance->m_address_book)._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count;
  local_58 = 1;
  local_50.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<unsigned_long>;
  local_50.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<unsigned_long>;
  local_60 = &local_50;
  local_50.m_value = local_80;
  tinyformat::detail::formatImpl((ostream *)&std::cout,"Address Book: %zu\n",&local_50,1);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void WalletShowInfo(CWallet* wallet_instance)
{
    LOCK(wallet_instance->cs_wallet);

    tfm::format(std::cout, "Wallet info\n===========\n");
    tfm::format(std::cout, "Name: %s\n", wallet_instance->GetName());
    tfm::format(std::cout, "Format: %s\n", wallet_instance->GetDatabase().Format());
    tfm::format(std::cout, "Descriptors: %s\n", wallet_instance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) ? "yes" : "no");
    tfm::format(std::cout, "Encrypted: %s\n", wallet_instance->IsCrypted() ? "yes" : "no");
    tfm::format(std::cout, "HD (hd seed available): %s\n", wallet_instance->IsHDEnabled() ? "yes" : "no");
    tfm::format(std::cout, "Keypool Size: %u\n", wallet_instance->GetKeyPoolSize());
    tfm::format(std::cout, "Transactions: %zu\n", wallet_instance->mapWallet.size());
    tfm::format(std::cout, "Address Book: %zu\n", wallet_instance->m_address_book.size());
}